

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

void BIT_flushBits(BIT_CStream_t *bitC)

{
  void *memPtr;
  ulong *in_RDI;
  size_t nbBytes;
  size_t in_stack_ffffffffffffffe8;
  
  memPtr = (void *)(ulong)((uint)in_RDI[1] >> 3);
  MEM_writeLEST(memPtr,in_stack_ffffffffffffffe8);
  in_RDI[3] = (long)memPtr + in_RDI[3];
  if (in_RDI[4] < in_RDI[3]) {
    in_RDI[3] = in_RDI[4];
  }
  *(uint *)(in_RDI + 1) = (uint)in_RDI[1] & 7;
  *in_RDI = *in_RDI >> ((byte)((long)memPtr << 3) & 0x3f);
  return;
}

Assistant:

MEM_STATIC void BIT_flushBits(BIT_CStream_t* bitC)
{
    size_t const nbBytes = bitC->bitPos >> 3;
    assert(bitC->bitPos < sizeof(bitC->bitContainer) * 8);
    MEM_writeLEST(bitC->ptr, bitC->bitContainer);
    bitC->ptr += nbBytes;
    if (bitC->ptr > bitC->endPtr) bitC->ptr = bitC->endPtr;
    bitC->bitPos &= 7;
    bitC->bitContainer >>= nbBytes*8;
}